

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_widgets.cpp
# Opt level: O3

bool QTest::qWaitForWindowExposed(QWidget *widget,int timeout)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  QWidget *pQVar4;
  QWindow *pQVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QDeadlineTimer local_58;
  long local_48;
  uint uStack_40;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QWidget::window(widget);
  pQVar5 = QWidget::windowHandle(pQVar4);
  if (pQVar5 == (QWindow *)0x0) {
    bVar3 = false;
  }
  else {
    QDeadlineTimer::QDeadlineTimer(&local_58,(long)timeout,PreciseTimer);
    local_48 = local_58.t1;
    uStack_40 = local_58.t2;
    uStack_3c = local_58.type;
    pQVar4 = QWidget::window(widget);
    pQVar5 = QWidget::windowHandle(pQVar4);
    if (pQVar5 != (QWindow *)0x0) {
      cVar1 = QWindow::isExposed();
      bVar3 = true;
      if (cVar1 != '\0') goto LAB_002f3ffb;
    }
    do {
      QCoreApplication::processEvents();
      QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
      pQVar4 = QWidget::window(widget);
      pQVar5 = QWidget::windowHandle(pQVar4);
      if ((pQVar5 != (QWindow *)0x0) && (cVar1 = QWindow::isExposed(), cVar1 != '\0')) {
        bVar3 = true;
        goto LAB_002f3ffb;
      }
      uVar6 = 0x7fffffffffffffff;
      if ((local_48 == 0x7fffffffffffffff) ||
         (uVar6 = QDeadlineTimer::rawRemainingTimeNSecs(), 0 < (long)uVar6)) {
        uVar7 = uVar6 / 1000000 + (ulong)((uVar6 / 1000000) * 1000000 < uVar6);
        if (9 < uVar7) {
          uVar7 = 10;
        }
        QTest::qSleep(uVar7);
      }
      bVar2 = (byte)uVar6;
      cVar1 = QDeadlineTimer::hasExpired();
    } while (cVar1 == '\0');
    pQVar4 = QWidget::window(widget);
    pQVar5 = QWidget::windowHandle(pQVar4);
    if (pQVar5 != (QWindow *)0x0) {
      bVar2 = QWindow::isExposed();
    }
    bVar3 = (bool)(pQVar5 != (QWindow *)0x0 & bVar2);
  }
LAB_002f3ffb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

Q_WIDGETS_EXPORT bool QTest::qWaitForWindowExposed(QWidget *widget, int timeout)
{
    return qWaitForWidgetWindow([&]() { return widget->window()->windowHandle(); },
                                [&](QWindow *window) { return window->isExposed(); },
                                timeout);
}